

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_intel.cc
# Opt level: O2

void handle_cpu_env(uint32_t *out,char *in)

{
  char cVar1;
  char *in_RAX;
  ulong uVar2;
  ulonglong uVar3;
  int __base;
  char *end;
  
  cVar1 = *in;
  uVar2 = (ulong)((cVar1 + 0x84U & 0xfd) == 0);
  if (in[uVar2] == '0') {
    __base = 10;
    if (in[uVar2 + 1] == 'x') {
      __base = 0x10;
    }
  }
  else {
    __base = 10;
  }
  end = in_RAX;
  uVar3 = strtoull(in + uVar2,&end,__base);
  if ((end != in + uVar2) && (*end == '\0')) {
    if (cVar1 == '~') {
      *(ulonglong *)out = ~uVar3 & *(ulong *)out;
    }
    else if (cVar1 == '|') {
      *out = *out | (uint)uVar3;
      out[1] = out[1] | (uint)(uVar3 >> 0x20);
    }
    else {
      *(ulonglong *)out = uVar3;
    }
  }
  return;
}

Assistant:

static void handle_cpu_env(uint32_t *out, const char *in) {
  const int invert_op = in[0] == '~';
  const int or_op = in[0] == '|';
  const int skip_first_byte = invert_op || or_op;
  const int hex = in[skip_first_byte] == '0' && in[skip_first_byte + 1] == 'x';
  const int base = hex ? 16 : 10;

  const char *start = in + skip_first_byte;
  char *end;
  unsigned long long v = strtoull(start, &end, base);

  if (end == start || *end != '\0') {
    return;
  }

  if (invert_op) {
    out[0] &= ~v;
    out[1] &= ~(v >> 32);
  } else if (or_op) {
    out[0] |= v;
    out[1] |= (v >> 32);
  } else {
    out[0] = v;
    out[1] = v >> 32;
  }
}